

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3MaterialRenderer::~COpenGL3MaterialRenderer(COpenGL3MaterialRenderer *this)

{
  COpenGL3MaterialRenderer *in_stack_00000010;
  
  ~COpenGL3MaterialRenderer(in_stack_00000010);
  return;
}

Assistant:

COpenGL3MaterialRenderer::~COpenGL3MaterialRenderer()
{
	if (CallBack)
		CallBack->drop();

	if (Program) {
		GLuint shaders[8];
		GLint count;
		GL.GetAttachedShaders(Program, 8, &count, shaders);

		count = core::min_(count, 8);
		for (GLint i = 0; i < count; ++i)
			GL.DeleteShader(shaders[i]);
		GL.DeleteProgram(Program);
		Program = 0;
	}

	UniformInfo.clear();
}